

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O0

settings_pack * libtorrent::high_performance_seed(void)

{
  settings_pack *in_RDI;
  settings_pack *set;
  
  settings_pack::settings_pack(in_RDI);
  settings_pack::set_int(in_RDI,0x4060,0);
  settings_pack::set_int(in_RDI,0x4008,0x5dc);
  settings_pack::set_int(in_RDI,0x4007,2000);
  settings_pack::set_int(in_RDI,0x403d,0x500000);
  settings_pack::set_int(in_RDI,0x4063,10000);
  settings_pack::set_int(in_RDI,0x400e,500);
  settings_pack::set_bool(in_RDI,0x801b,true);
  settings_pack::set_int(in_RDI,0x4012,500);
  settings_pack::set_int(in_RDI,0x4055,8000);
  settings_pack::set_int(in_RDI,0x4061,3000);
  settings_pack::set_int(in_RDI,0x4053,-1);
  settings_pack::set_int(in_RDI,0x401a,0x700000);
  settings_pack::set_int(in_RDI,0x4018,0);
  settings_pack::set_int(in_RDI,0x4019,1);
  settings_pack::set_bool(in_RDI,0x800e,true);
  settings_pack::set_int(in_RDI,0x403a,10);
  settings_pack::set_int(in_RDI,0x4085,0x80000);
  settings_pack::set_int(in_RDI,0x4005,10);
  settings_pack::set_int(in_RDI,0x400a,0x14);
  settings_pack::set_int(in_RDI,0x4013,0x14);
  settings_pack::set_int(in_RDI,0x402f,20000);
  settings_pack::set_int(in_RDI,0x402d,2000);
  settings_pack::set_int(in_RDI,0x402c,600);
  settings_pack::set_int(in_RDI,0x402a,2000);
  settings_pack::set_int(in_RDI,0x401f,0);
  settings_pack::set_int(in_RDI,0x401d,0x300000);
  settings_pack::set_int(in_RDI,0x401e,0x96);
  settings_pack::set_int(in_RDI,0x401c,0x100000);
  settings_pack::set_int(in_RDI,0x400f,1);
  settings_pack::set_int(in_RDI,0x4068,8);
  settings_pack::set_int(in_RDI,0x4066,0x800);
  return in_RDI;
}

Assistant:

settings_pack high_performance_seed()
	{
		settings_pack set;
		// don't throttle TCP, assume there is
		// plenty of bandwidth
		set.set_int(settings_pack::mixed_mode_algorithm, settings_pack::prefer_tcp);

		set.set_int(settings_pack::max_out_request_queue, 1500);
		set.set_int(settings_pack::max_allowed_in_request_queue, 2000);

		set.set_int(settings_pack::max_peer_recv_buffer_size, 5 * 1024 * 1024);

		// we will probably see a high rate of alerts, make it less
		// likely to loose alerts
		set.set_int(settings_pack::alert_queue_size, 10000);

		// allow 500 files open at a time
		set.set_int(settings_pack::file_pool_size, 500);

		// don't update access time for each read/write
		set.set_bool(settings_pack::no_atime_storage, true);

		// as a seed box, we must accept multiple peers behind
		// the same NAT
//		set.set_bool(settings_pack::allow_multiple_connections_per_ip, true);

		// connect to 50 peers per second
		set.set_int(settings_pack::connection_speed, 500);

		// allow 8000 peer connections
		set.set_int(settings_pack::connections_limit, 8000);

		// allow lots of peers to try to connect simultaneously
		set.set_int(settings_pack::listen_queue_size, 3000);

		// unchoke all peers
		set.set_int(settings_pack::unchoke_slots_limit, -1);

		// the max number of bytes pending write before we throttle
		// download rate
		set.set_int(settings_pack::max_queued_disk_bytes, 7 * 1024 * 1024);

		// prevent fast pieces to interfere with suggested pieces
		// since we unchoke everyone, we don't need fast pieces anyway
		set.set_int(settings_pack::allowed_fast_set_size, 0);

		// suggest pieces in the read cache for higher cache hit rate
		set.set_int(settings_pack::suggest_mode, settings_pack::suggest_read_cache);

		set.set_bool(settings_pack::close_redundant_connections, true);

		set.set_int(settings_pack::max_rejects, 10);

		set.set_int(settings_pack::send_not_sent_low_watermark, 524288);

		// don't let connections linger for too long
		set.set_int(settings_pack::request_timeout, 10);
		set.set_int(settings_pack::peer_timeout, 20);
		set.set_int(settings_pack::inactivity_timeout, 20);

		set.set_int(settings_pack::active_limit, 20000);
		set.set_int(settings_pack::active_tracker_limit, 2000);
		set.set_int(settings_pack::active_dht_limit, 600);
		set.set_int(settings_pack::active_seeds, 2000);

		set.set_int(settings_pack::choking_algorithm, settings_pack::fixed_slots_choker);

		// of 500 ms, and a send rate of 4 MB/s, the upper
		// limit should be 2 MB
		set.set_int(settings_pack::send_buffer_watermark, 3 * 1024 * 1024);

		// put 1.5 seconds worth of data in the send buffer
		// this gives the disk I/O more heads-up on disk
		// reads, and can maximize throughput
		set.set_int(settings_pack::send_buffer_watermark_factor, 150);

		// always stuff at least 1 MiB down each peer
		// pipe, to quickly ramp up send rates
		set.set_int(settings_pack::send_buffer_low_watermark, 1 * 1024 * 1024);

		// don't retry peers if they fail once. Let them
		// connect to us if they want to
		set.set_int(settings_pack::max_failcount, 1);

		// number of disk threads for low level file operations
		set.set_int(settings_pack::aio_threads, 8);

		set.set_int(settings_pack::checking_mem_usage, 2048);

		return set;
	}